

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

int Extra_ProfileWidth(DdManager *dd,DdNode *Func,int *pProfile,int CutLevel)

{
  int iVar1;
  uint uVar2;
  st__table *tNodes;
  st__generator *psVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  int LevelStart;
  DdNode *node;
  int local_58;
  undefined4 uStack_54;
  uint *local_50;
  st__table *local_48;
  st__table *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,CutLevel);
  local_48 = st__init_table(st__ptrcmp,st__ptrhash);
  iVar1 = st__find_or_add(local_48,(char *)Func,(char ***)&local_58);
  if ((iVar1 == 0) || (0 < *(int *)CONCAT44(uStack_54,local_58))) {
    *(int *)CONCAT44(uStack_54,local_58) = 0;
  }
  tNodes = st__init_table(st__ptrcmp,st__ptrhash);
  extraCollectNodes(Func,tNodes);
  local_40 = tNodes;
  psVar3 = st__init_gen(tNodes);
  iVar1 = st__gen(psVar3,(char **)&local_50,(char **)0x0);
  if (iVar1 != 0) {
    do {
      piVar7 = (int *)((ulong)local_50 & 0xfffffffffffffffe);
      if (*piVar7 != 0x7fffffff) {
        iVar6 = dd->perm[*local_50] + 1;
        iVar1 = st__find_or_add(local_48,*(char **)(piVar7 + 6),(char ***)&local_58);
        if ((iVar1 == 0) || (iVar6 < *(int *)CONCAT44(uStack_54,local_58))) {
          *(int *)CONCAT44(uStack_54,local_58) = iVar6;
        }
        iVar6 = dd->perm[*local_50] + 1;
        iVar1 = st__find_or_add(local_48,*(char **)(piVar7 + 4),(char ***)&local_58);
        if ((iVar1 == 0) || (iVar6 < *(int *)CONCAT44(uStack_54,local_58))) {
          *(int *)CONCAT44(uStack_54,local_58) = iVar6;
        }
      }
      iVar1 = st__gen(psVar3,(char **)&local_50,(char **)0x0);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar3);
  st__free_table(local_40);
  iVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar1 = dd->sizeZ;
  }
  if (-1 < iVar1) {
    memset(pProfile,0,(ulong)(iVar1 + 1U) << 2);
  }
  local_40 = (st__table *)CONCAT44(local_40._4_4_,iVar1 + 1U);
  psVar3 = st__init_gen(local_48);
  iVar1 = st__gen(psVar3,(char **)&local_50,(char **)&local_58);
  if (iVar1 != 0) {
    do {
      piVar7 = &dd->size;
      if ((ulong)*(uint *)((ulong)local_50 & 0xfffffffffffffffe) != 0x7fffffff) {
        piVar7 = dd->perm + *(uint *)((ulong)local_50 & 0xfffffffffffffffe);
      }
      iVar1 = *piVar7;
      if (local_58 <= iVar1) {
        lVar5 = 0;
        do {
          pProfile[local_58 + lVar5] = pProfile[local_58 + lVar5] + 1;
          lVar5 = lVar5 + 1;
        } while ((iVar1 - local_58) + 1 != (int)lVar5);
      }
      iVar1 = st__gen(psVar3,(char **)&local_50,(char **)&local_58);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar3);
  uVar2 = (uint)local_40;
  if ((uint)local_38 - 1 < 0xfffffffe) {
    uVar2 = (uint)local_38;
  }
  if ((int)uVar2 < 1) {
    iVar1 = 0;
  }
  else {
    uVar4 = 0;
    iVar1 = 0;
    do {
      if (iVar1 <= pProfile[uVar4]) {
        iVar1 = pProfile[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  st__free_table(local_48);
  return iVar1;
}

Assistant:

int Extra_ProfileWidth( DdManager * dd, DdNode * Func, int * pProfile, int CutLevel )
{
    st__generator * gen;
    st__table * tNodeTopRef; // this table stores the top level from which this node is pointed to
    st__table * tNodes;
    DdNode * node;
    DdNode * nodeR;
    int LevelStart, Limit;
    int i, size;
    int WidthMax;
  
    // start the mapping table
    tNodeTopRef = st__init_table( st__ptrcmp, st__ptrhash);;
    // add the topmost node to the profile
    extraProfileUpdateTopLevel( tNodeTopRef, 0, Func );

    // collect all nodes
    tNodes = Extra_CollectNodes( Func );
    // go though all the nodes and set the top level the cofactors are pointed from
//  Cudd_ForeachNode( dd, Func, genDD, node )
    st__foreach_item( tNodes, gen, (const char**)&node, NULL )
    {
//      assert( Cudd_Regular(node) );  // this procedure works only with ADD/ZDD (not BDD w/ compl.edges)
        nodeR = Cudd_Regular(node);
        if ( cuddIsConstant(nodeR) )
            continue;
        // this node is not a constant - consider its cofactors
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddE(nodeR) );
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddT(nodeR) );
    }
    st__free_table( tNodes );

    // clean the profile
    size = ddMax(dd->size, dd->sizeZ) + 1;
    for ( i = 0; i < size; i++ ) 
        pProfile[i] = 0;

    // create the profile
    st__foreach_item( tNodeTopRef, gen, (const char**)&node, (char**)&LevelStart )
    {
        nodeR = Cudd_Regular(node);
        Limit = (cuddIsConstant(nodeR))? dd->size: dd->perm[nodeR->index];
        for ( i = LevelStart; i <= Limit; i++ )
            pProfile[i]++;
    }

    if ( CutLevel != -1 && CutLevel != 0  )
        size = CutLevel;

    // get the max width
    WidthMax = 0;
    for ( i = 0; i < size; i++ ) 
        if ( WidthMax < pProfile[i] )
            WidthMax = pProfile[i];

    // deref the table
    st__free_table( tNodeTopRef );

    return WidthMax;
}